

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O1

void ft_stroke_border_close(PVG_FT_StrokeBorder border,PVG_FT_Bool reverse)

{
  uint uVar1;
  PVG_FT_Byte PVar2;
  PVG_FT_UInt PVar3;
  uint uVar4;
  PVG_FT_Pos PVar5;
  PVG_FT_Pos PVar6;
  PVG_FT_Pos PVar7;
  long lVar8;
  PVG_FT_Byte *pPVar9;
  PVG_FT_Vector *pPVar10;
  PVG_FT_Byte *pPVar11;
  PVG_FT_Vector *pPVar12;
  bool bVar13;
  PVG_FT_Vector tmp;
  
  PVar3 = border->start;
  lVar8 = (long)(int)PVar3;
  if (-1 < lVar8) {
    uVar4 = border->num_points;
    if (PVar3 + 1 < uVar4) {
      uVar1 = uVar4 - 1;
      border->num_points = uVar1;
      pPVar12 = border->points + uVar1;
      PVar5 = pPVar12->y;
      pPVar10 = border->points + lVar8;
      pPVar10->x = pPVar12->x;
      pPVar10->y = PVar5;
      border->tags[lVar8] = border->tags[uVar1];
      if (reverse != '\0') {
        pPVar12 = border->points;
        pPVar10 = pPVar12 + lVar8 + 1;
        if (pPVar10 < pPVar12 + ((ulong)uVar1 - 1)) {
          pPVar12 = pPVar12 + ((ulong)uVar1 - 2);
          do {
            PVar5 = pPVar10->x;
            PVar6 = pPVar10->y;
            PVar7 = pPVar12[1].y;
            pPVar10->x = pPVar12[1].x;
            pPVar10->y = PVar7;
            pPVar12[1].x = PVar5;
            pPVar12[1].y = PVar6;
            pPVar10 = pPVar10 + 1;
            bVar13 = pPVar10 < pPVar12;
            pPVar12 = pPVar12 + -1;
          } while (bVar13);
        }
        pPVar9 = border->tags;
        pPVar11 = pPVar9 + lVar8 + 1;
        if (pPVar11 < pPVar9 + ((ulong)uVar1 - 1)) {
          pPVar9 = pPVar9 + ((ulong)uVar1 - 2);
          do {
            PVar2 = *pPVar11;
            *pPVar11 = pPVar9[1];
            pPVar9[1] = PVar2;
            pPVar11 = pPVar11 + 1;
            bVar13 = pPVar11 < pPVar9;
            pPVar9 = pPVar9 + -1;
          } while (bVar13);
        }
      }
      border->tags[lVar8] = border->tags[lVar8] | 4;
      border->tags[uVar4 - 2] = border->tags[uVar4 - 2] | 8;
    }
    else {
      border->num_points = PVar3;
    }
    border->start = -1;
    border->movable = '\0';
    return;
  }
  __assert_fail("border->start >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-ft-stroker.c"
                ,0x111,"void ft_stroke_border_close(PVG_FT_StrokeBorder, PVG_FT_Bool)");
}

Assistant:

static void ft_stroke_border_close(PVG_FT_StrokeBorder border,
                                   PVG_FT_Bool         reverse)
{
    PVG_FT_UInt start = border->start;
    PVG_FT_UInt count = border->num_points;

    assert(border->start >= 0);

    /* don't record empty paths! */
    if (count <= start + 1U)
        border->num_points = start;
    else {
        /* copy the last point to the start of this sub-path, since */
        /* it contains the `adjusted' starting coordinates          */
        border->num_points = --count;
        border->points[start] = border->points[count];
        border->tags[start]   = border->tags[count];

        if (reverse) {
            /* reverse the points */
            {
                PVG_FT_Vector* vec1 = border->points + start + 1;
                PVG_FT_Vector* vec2 = border->points + count - 1;

                for (; vec1 < vec2; vec1++, vec2--) {
                    PVG_FT_Vector tmp;

                    tmp = *vec1;
                    *vec1 = *vec2;
                    *vec2 = tmp;
                }
            }

            /* then the tags */
            {
                PVG_FT_Byte* tag1 = border->tags + start + 1;
                PVG_FT_Byte* tag2 = border->tags + count - 1;

                for (; tag1 < tag2; tag1++, tag2--) {
                    PVG_FT_Byte tmp;

                    tmp = *tag1;
                    *tag1 = *tag2;
                    *tag2 = tmp;
                }
            }
        }

        border->tags[start] |= PVG_FT_STROKE_TAG_BEGIN;
        border->tags[count - 1] |= PVG_FT_STROKE_TAG_END;
    }

    border->start = -1;
    border->movable = FALSE;
}